

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

ssize_t file_read_asciiz(FILE *stream,char *buffer,size_t size)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  
  for (uVar3 = 1; uVar2 = (ulong)(uVar3 - 1), uVar2 < size; uVar3 = uVar3 + 1) {
    if ((size - 1 == uVar2) || (iVar1 = getc_unlocked((FILE *)stream), iVar1 == -1)) {
      return -1;
    }
    buffer[uVar2] = (char)iVar1;
    if (iVar1 == 0) break;
  }
  return (ulong)uVar3;
}

Assistant:

ssize_t
file_read_asciiz(
    FILE* stream,
    char* buffer,
    size_t size)
{
    unsigned int i;
    int c;
    for (i = 0; i < size; ++i) {
        if (i == size - 1) {
            return -1;
        }
        c = getc_unlocked(stream);
        if (c == EOF) {
            return -1;
        }
        buffer[i] = c;
        if (!c)
            break;
    }
    return i + 1;
}